

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O1

SPxId __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterHyperCoDim
          (SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *feastol)

{
  uint *puVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  pointer pnVar3;
  int *piVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int32_t iVar8;
  int iVar9;
  int iVar10;
  DataKey DVar11;
  long lVar12;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_R8;
  pointer pnVar13;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int local_28c;
  cpp_dec_float<50U,_int,_void> local_288;
  cpp_dec_float<50U,_int,_void> *local_248;
  pointer local_240;
  cpp_dec_float<50U,_int,_void> local_238;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1f0;
  cpp_dec_float<50U,_int,_void> local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  devexpr local_128 [8];
  uint auStack_120 [2];
  uint local_118 [2];
  undefined8 uStack_110;
  uint local_108 [2];
  int local_100;
  byte local_fc;
  fpclass_type local_f8;
  int32_t iStack_f4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  devexpr local_68 [8];
  uint auStack_60 [2];
  uint local_58 [2];
  undefined8 uStack_50;
  uint local_48 [2];
  int local_40;
  byte local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  pSVar2 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar3 = (pSVar2->theTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_240 = (pSVar2->weights).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_248 = &best->m_backend;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&local_1e8,-1,(type *)0x0);
  local_288.fpclass = cpp_dec_float_finite;
  local_288.prec_elem = 10;
  local_288.data._M_elems[0] = 0;
  local_288.data._M_elems[1] = 0;
  local_288.data._M_elems[2] = 0;
  local_288.data._M_elems[3] = 0;
  local_288.data._M_elems[4] = 0;
  local_288.data._M_elems[5] = 0;
  local_288.data._M_elems._24_5_ = 0;
  local_288.data._M_elems[7]._1_3_ = 0;
  local_288.data._M_elems[8] = 0;
  local_288.data._M_elems[9] = 0;
  local_288.exp = 0;
  local_288.neg = false;
  lVar12 = (long)(this->bestPricesCo).super_IdxSet.num;
  if (lVar12 < 1) {
    local_28c = -1;
  }
  else {
    local_1f8 = &this->last;
    lVar12 = lVar12 + 1;
    local_28c = -1;
    do {
      iVar10 = (this->bestPricesCo).super_IdxSet.idx[lVar12 + -2];
      local_288.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar3[iVar10].m_backend.data + 0x20);
      local_288.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[iVar10].m_backend.data;
      local_288.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar3[iVar10].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar3[iVar10].m_backend.data + 0x10);
      local_288.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar5 = *(undefined8 *)(puVar1 + 2);
      local_288.data._M_elems._24_5_ = SUB85(uVar5,0);
      local_288.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
      local_288.exp = pnVar3[iVar10].m_backend.exp;
      local_288.neg = pnVar3[iVar10].m_backend.neg;
      local_288.fpclass = pnVar3[iVar10].m_backend.fpclass;
      local_288.prec_elem = pnVar3[iVar10].m_backend.prec_elem;
      local_238.data._M_elems._32_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
      local_238.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
      local_238.data._M_elems._8_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
      local_238.data._M_elems._16_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
      local_238.data._M_elems._24_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
      local_238.exp = (feastol->m_backend).exp;
      local_238.neg = (feastol->m_backend).neg;
      local_238.fpclass = (feastol->m_backend).fpclass;
      local_238.prec_elem = (feastol->m_backend).prec_elem;
      if (local_238.data._M_elems[0] != 0 || local_238.fpclass != cpp_dec_float_finite) {
        local_238.neg = (bool)(local_238.neg ^ 1);
      }
      if ((local_238.fpclass == cpp_dec_float_NaN || local_288.fpclass == cpp_dec_float_NaN) ||
         (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_288,&local_238), -1 < iVar9)) {
        piVar4 = (this->bestPricesCo).super_IdxSet.idx;
        iVar9 = (this->bestPricesCo).super_IdxSet.num;
        (this->bestPricesCo).super_IdxSet.num = iVar9 + -1;
        piVar4[lVar12 + -2] = piVar4[(long)iVar9 + -1];
        (((this->
          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thesolver)->isInfeasibleCo).data[iVar10] = 0;
      }
      else {
        uStack_50 = CONCAT35(local_288.data._M_elems[7]._1_3_,local_288.data._M_elems._24_5_);
        local_68 = (devexpr  [8])local_288.data._M_elems._0_8_;
        auStack_60[0] = local_288.data._M_elems[2];
        auStack_60[1] = local_288.data._M_elems[3];
        local_58[0] = local_288.data._M_elems[4];
        local_58[1] = local_288.data._M_elems[5];
        local_48[0] = local_288.data._M_elems[8];
        local_48[1] = local_288.data._M_elems[9];
        local_40 = local_288.exp;
        local_3c = local_288.neg;
        local_38 = local_288.fpclass;
        iStack_34 = local_288.prec_elem;
        local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&local_240[iVar10].m_backend.data;
        local_a8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((long)&local_240[iVar10].m_backend.data + 8);
        puVar1 = (uint *)((long)&local_240[iVar10].m_backend.data + 0x10);
        local_a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        local_a8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((long)&local_240[iVar10].m_backend.data + 0x20);
        local_a8.m_backend.exp = local_240[iVar10].m_backend.exp;
        local_a8.m_backend.neg = local_240[iVar10].m_backend.neg;
        local_a8.m_backend.fpclass = local_240[iVar10].m_backend.fpclass;
        local_a8.m_backend.prec_elem = local_240[iVar10].m_backend.prec_elem;
        local_e8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
        local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
        local_e8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
        local_e8.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
        local_e8.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
        local_e8.m_backend.exp = (feastol->m_backend).exp;
        local_e8.m_backend.neg = (feastol->m_backend).neg;
        local_e8.m_backend.fpclass = (feastol->m_backend).fpclass;
        local_e8.m_backend.prec_elem = (feastol->m_backend).prec_elem;
        devexpr::
        computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_238,local_68,&local_a8,&local_e8,in_R8);
        local_288.data._M_elems[8] = local_238.data._M_elems[8];
        local_288.data._M_elems[9] = local_238.data._M_elems[9];
        local_288.data._M_elems[4] = local_238.data._M_elems[4];
        local_288.data._M_elems[5] = local_238.data._M_elems[5];
        local_288.data._M_elems._24_5_ = local_238.data._M_elems._24_5_;
        local_288.data._M_elems[7]._1_3_ = local_238.data._M_elems[7]._1_3_;
        local_288.data._M_elems[0] = local_238.data._M_elems[0];
        local_288.data._M_elems[1] = local_238.data._M_elems[1];
        local_288.data._M_elems[2] = local_238.data._M_elems[2];
        local_288.data._M_elems[3] = local_238.data._M_elems[3];
        local_288.exp = local_238.exp;
        local_288.neg = local_238.neg;
        local_288.fpclass = local_238.fpclass;
        local_288.prec_elem = local_238.prec_elem;
        if (((local_238.fpclass != cpp_dec_float_NaN) && (local_248->fpclass != cpp_dec_float_NaN))
           && (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_288,local_248), 0 < iVar9)) {
          pnVar13 = local_240 + iVar10;
          *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&local_248->data)->data)._M_elems + 8)
               = local_288.data._M_elems._32_8_;
          *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&local_248->data)->data)._M_elems + 4)
               = local_288.data._M_elems._16_8_;
          *(ulong *)((((cpp_dec_float<50U,_int,_void> *)&local_248->data)->data)._M_elems + 6) =
               CONCAT35(local_288.data._M_elems[7]._1_3_,local_288.data._M_elems._24_5_);
          *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&local_248->data)->data)._M_elems =
               local_288.data._M_elems._0_8_;
          *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&local_248->data)->data)._M_elems + 2)
               = local_288.data._M_elems._8_8_;
          local_248->exp = local_288.exp;
          local_248->neg = local_288.neg;
          local_248->fpclass = local_288.fpclass;
          local_248->prec_elem = local_288.prec_elem;
          *(undefined8 *)((local_1f8->m_backend).data._M_elems + 8) =
               *(undefined8 *)((long)&(pnVar13->m_backend).data + 0x20);
          uVar5 = *(undefined8 *)&(pnVar13->m_backend).data;
          uVar6 = *(undefined8 *)((long)&(pnVar13->m_backend).data + 8);
          uVar7 = *(undefined8 *)((long)&(pnVar13->m_backend).data + 0x18);
          *(undefined8 *)((local_1f8->m_backend).data._M_elems + 4) =
               *(undefined8 *)((long)&(pnVar13->m_backend).data + 0x10);
          *(undefined8 *)((local_1f8->m_backend).data._M_elems + 6) = uVar7;
          *(undefined8 *)(local_1f8->m_backend).data._M_elems = uVar5;
          *(undefined8 *)((local_1f8->m_backend).data._M_elems + 2) = uVar6;
          (this->last).m_backend.exp = (pnVar13->m_backend).exp;
          (this->last).m_backend.neg = (pnVar13->m_backend).neg;
          iVar8 = (pnVar13->m_backend).prec_elem;
          (this->last).m_backend.fpclass = (pnVar13->m_backend).fpclass;
          (this->last).m_backend.prec_elem = iVar8;
          local_28c = iVar10;
        }
        if (((local_288.fpclass == cpp_dec_float_NaN) || (local_1e8.fpclass == cpp_dec_float_NaN))
           || (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_288,&local_1e8), -1 < iVar10)) {
          if (local_1e8.fpclass != cpp_dec_float_NaN) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                      (&local_238,0,(type *)0x0);
            iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_1e8,&local_238);
            if (iVar10 < 0) goto LAB_0029ccea;
          }
        }
        else {
LAB_0029ccea:
          local_1e8.data._M_elems[8] = local_288.data._M_elems[8];
          local_1e8.data._M_elems[9] = local_288.data._M_elems[9];
          local_1e8.data._M_elems[0] = local_288.data._M_elems[0];
          local_1e8.data._M_elems[1] = local_288.data._M_elems[1];
          local_1e8.data._M_elems[2] = local_288.data._M_elems[2];
          local_1e8.data._M_elems[3] = local_288.data._M_elems[3];
          local_1e8.data._M_elems[4] = local_288.data._M_elems[4];
          local_1e8.data._M_elems[5] = local_288.data._M_elems[5];
          local_1e8.data._M_elems[7]._1_3_ = local_288.data._M_elems[7]._1_3_;
          local_1e8.data._M_elems._24_5_ = local_288.data._M_elems._24_5_;
          local_1e8.exp = local_288.exp;
          local_1e8.neg = local_288.neg;
          local_1e8.fpclass = local_288.fpclass;
          local_1e8.prec_elem = local_288.prec_elem;
        }
      }
      lVar12 = lVar12 + -1;
    } while (1 < lVar12);
  }
  lVar12 = (long)(((this->
                   super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver)->updateViolsCo).super_IdxSet.num;
  if (0 < lVar12) {
    local_1f8 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&this->bestPricesCo;
    local_1f0 = &this->last;
    lVar12 = lVar12 + 1;
    do {
      pSVar2 = (this->
               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
      iVar10 = (pSVar2->updateViolsCo).super_IdxSet.idx[lVar12 + -2];
      if ((pSVar2->isInfeasibleCo).data[iVar10] == 1) {
        local_288.data._M_elems._32_8_ =
             *(undefined8 *)((long)&pnVar3[iVar10].m_backend.data + 0x20);
        local_288.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[iVar10].m_backend.data;
        local_288.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar3[iVar10].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar3[iVar10].m_backend.data + 0x10);
        local_288.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        uVar5 = *(undefined8 *)(puVar1 + 2);
        local_288.data._M_elems._24_5_ = SUB85(uVar5,0);
        local_288.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
        local_288.exp = pnVar3[iVar10].m_backend.exp;
        local_288.neg = pnVar3[iVar10].m_backend.neg;
        local_288.fpclass = pnVar3[iVar10].m_backend.fpclass;
        local_288.prec_elem = pnVar3[iVar10].m_backend.prec_elem;
        local_238.data._M_elems._32_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
        local_238.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
        local_238.data._M_elems._8_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
        local_238.data._M_elems._16_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
        local_238.data._M_elems._24_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
        local_238.exp = (feastol->m_backend).exp;
        local_238.neg = (feastol->m_backend).neg;
        local_238.fpclass = (feastol->m_backend).fpclass;
        local_238.prec_elem = (feastol->m_backend).prec_elem;
        if (local_238.data._M_elems[0] != 0 || local_238.fpclass != cpp_dec_float_finite) {
          local_238.neg = (bool)(local_238.neg ^ 1);
        }
        if ((local_238.fpclass == cpp_dec_float_NaN || local_288.fpclass == cpp_dec_float_NaN) ||
           (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_288,&local_238), -1 < iVar9)) {
          (((this->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thesolver)->isInfeasibleCo).data[iVar10] = 0;
        }
        else {
          uStack_110 = CONCAT35(local_288.data._M_elems[7]._1_3_,local_288.data._M_elems._24_5_);
          local_128 = (devexpr  [8])local_288.data._M_elems._0_8_;
          auStack_120[0] = local_288.data._M_elems[2];
          auStack_120[1] = local_288.data._M_elems[3];
          local_118[0] = local_288.data._M_elems[4];
          local_118[1] = local_288.data._M_elems[5];
          local_108[0] = local_288.data._M_elems[8];
          local_108[1] = local_288.data._M_elems[9];
          local_100 = local_288.exp;
          local_fc = local_288.neg;
          local_f8 = local_288.fpclass;
          iStack_f4 = local_288.prec_elem;
          local_168.m_backend.data._M_elems._0_8_ = *(undefined8 *)&local_240[iVar10].m_backend.data
          ;
          local_168.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)((long)&local_240[iVar10].m_backend.data + 8);
          puVar1 = (uint *)((long)&local_240[iVar10].m_backend.data + 0x10);
          local_168.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
          local_168.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
          local_168.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((long)&local_240[iVar10].m_backend.data + 0x20);
          local_168.m_backend.exp = local_240[iVar10].m_backend.exp;
          local_168.m_backend.neg = local_240[iVar10].m_backend.neg;
          local_168.m_backend.fpclass = local_240[iVar10].m_backend.fpclass;
          local_168.m_backend.prec_elem = local_240[iVar10].m_backend.prec_elem;
          local_1a8.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
          local_1a8.m_backend.data._M_elems._0_8_ =
               *(undefined8 *)(feastol->m_backend).data._M_elems;
          local_1a8.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
          local_1a8.m_backend.data._M_elems._16_8_ =
               *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
          local_1a8.m_backend.data._M_elems._24_8_ =
               *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
          local_1a8.m_backend.exp = (feastol->m_backend).exp;
          local_1a8.m_backend.neg = (feastol->m_backend).neg;
          local_1a8.m_backend.fpclass = (feastol->m_backend).fpclass;
          local_1a8.m_backend.prec_elem = (feastol->m_backend).prec_elem;
          devexpr::
          computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_238,local_128,&local_168,&local_1a8,in_R8);
          local_288.data._M_elems[8] = local_238.data._M_elems[8];
          local_288.data._M_elems[9] = local_238.data._M_elems[9];
          local_288.data._M_elems[4] = local_238.data._M_elems[4];
          local_288.data._M_elems[5] = local_238.data._M_elems[5];
          local_288.data._M_elems._24_5_ = local_238.data._M_elems._24_5_;
          local_288.data._M_elems[7]._1_3_ = local_238.data._M_elems[7]._1_3_;
          local_288.data._M_elems[0] = local_238.data._M_elems[0];
          local_288.data._M_elems[1] = local_238.data._M_elems[1];
          local_288.data._M_elems[2] = local_238.data._M_elems[2];
          local_288.data._M_elems[3] = local_238.data._M_elems[3];
          local_288.exp = local_238.exp;
          local_288.neg = local_238.neg;
          local_288.fpclass = local_238.fpclass;
          local_288.prec_elem = local_238.prec_elem;
          if ((local_238.fpclass != cpp_dec_float_NaN) &&
             ((local_1e8.fpclass != cpp_dec_float_NaN &&
              (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_288,&local_1e8), 0 < iVar9)))) {
            if ((local_288.fpclass != cpp_dec_float_NaN) &&
               ((local_248->fpclass != cpp_dec_float_NaN &&
                (iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_288,local_248), 0 < iVar9)))) {
              pnVar13 = local_240 + iVar10;
              *(undefined8 *)
               ((((cpp_dec_float<50U,_int,_void> *)&local_248->data)->data)._M_elems + 8) =
                   local_288.data._M_elems._32_8_;
              *(undefined8 *)
               ((((cpp_dec_float<50U,_int,_void> *)&local_248->data)->data)._M_elems + 4) =
                   local_288.data._M_elems._16_8_;
              *(ulong *)((((cpp_dec_float<50U,_int,_void> *)&local_248->data)->data)._M_elems + 6) =
                   CONCAT35(local_288.data._M_elems[7]._1_3_,local_288.data._M_elems._24_5_);
              *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&local_248->data)->data)._M_elems =
                   local_288.data._M_elems._0_8_;
              *(undefined8 *)
               ((((cpp_dec_float<50U,_int,_void> *)&local_248->data)->data)._M_elems + 2) =
                   local_288.data._M_elems._8_8_;
              local_248->exp = local_288.exp;
              local_248->neg = local_288.neg;
              local_248->fpclass = local_288.fpclass;
              local_248->prec_elem = local_288.prec_elem;
              *(undefined8 *)((local_1f0->m_backend).data._M_elems + 8) =
                   *(undefined8 *)((long)&(pnVar13->m_backend).data + 0x20);
              uVar5 = *(undefined8 *)&(pnVar13->m_backend).data;
              uVar6 = *(undefined8 *)((long)&(pnVar13->m_backend).data + 8);
              uVar7 = *(undefined8 *)((long)&(pnVar13->m_backend).data + 0x18);
              *(undefined8 *)((local_1f0->m_backend).data._M_elems + 4) =
                   *(undefined8 *)((long)&(pnVar13->m_backend).data + 0x10);
              *(undefined8 *)((local_1f0->m_backend).data._M_elems + 6) = uVar7;
              *(undefined8 *)(local_1f0->m_backend).data._M_elems = uVar5;
              *(undefined8 *)((local_1f0->m_backend).data._M_elems + 2) = uVar6;
              (this->last).m_backend.exp = (pnVar13->m_backend).exp;
              (this->last).m_backend.neg = (pnVar13->m_backend).neg;
              iVar8 = (pnVar13->m_backend).prec_elem;
              (this->last).m_backend.fpclass = (pnVar13->m_backend).fpclass;
              (this->last).m_backend.prec_elem = iVar8;
              local_28c = iVar10;
            }
            (((this->
              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thesolver)->isInfeasibleCo).data[iVar10] = 2;
            DIdxSet::addIdx((DIdxSet *)local_1f8,iVar10);
          }
        }
      }
      lVar12 = lVar12 + -1;
    } while (1 < lVar12);
  }
  if (local_28c < 0) {
    DVar11.info = 0;
    DVar11.idx = -1;
  }
  else {
    DVar11 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::id((this->
                           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).thesolver,local_28c);
  }
  return (SPxId)DVar11;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnterHyperCoDim(R& best, R feastol)
{
   const R* test = this->thesolver->test().get_const_ptr();
   const R* pen = this->thesolver->weights.get_const_ptr();
   R leastBest = -1;
   R x;
   int enterIdx = -1;
   int idx;

   // find the best price from short candidate list
   for(int i = bestPricesCo.size() - 1; i >= 0; --i)
   {
      idx = bestPricesCo.index(i);
      x = test[idx];

      if(x < -feastol)
      {
         x = devexpr::computePrice(x, pen[idx], feastol);

         assert(x >= 0);

         // update the best price of candidate list
         if(x > best)
         {
            best = x;
            enterIdx = idx;
            last = pen[idx];
         }

         // update the smallest price of candidate list
         if(x < leastBest || leastBest < 0)
            leastBest = x;
      }
      else
      {
         bestPricesCo.remove(i);
         this->thesolver->isInfeasibleCo[idx] = this->NOT_VIOLATED;
      }
   }

   //scan the updated indeces for a better price
   for(int i = this->thesolver->updateViolsCo.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->updateViolsCo.index(i);

      // only look at indeces that were not checked already
      if(this->thesolver->isInfeasibleCo[idx] == this->VIOLATED)
      {
         x = test[idx];

         if(x < -feastol)
         {
            x = devexpr::computePrice(x, pen[idx], feastol);

            if(x > leastBest)
            {
               if(x > best)
               {
                  best = x;
                  enterIdx = idx;
                  last = pen[idx];
               }

               // put index into candidate list
               this->thesolver->isInfeasibleCo[idx] = this->VIOLATED_AND_CHECKED;
               bestPricesCo.addIdx(idx);
            }
         }
         else
         {
            this->thesolver->isInfeasibleCo[idx] = this->NOT_VIOLATED;
         }
      }
   }

   if(enterIdx >= 0)
      return this->thesolver->id(enterIdx);
   else
      return SPxId();
}